

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::BatchedMatMulLayerParams
          (BatchedMatMulLayerParams *this,BatchedMatMulLayerParams *from)

{
  ulong uVar1;
  WeightParams *pWVar2;
  uint64_t uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  WeightParams *pWVar7;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BatchedMatMulLayerParams_004b6d28;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  pWVar2 = from->weights_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (BatchedMatMulLayerParams *)_BatchedMatMulLayerParams_default_instance_) {
    pWVar7 = (WeightParams *)0x0;
  }
  else {
    pWVar7 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar7,pWVar2);
  }
  this->weights_ = pWVar7;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (BatchedMatMulLayerParams *)_BatchedMatMulLayerParams_default_instance_) {
    pWVar7 = (WeightParams *)0x0;
  }
  else {
    pWVar7 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar7,pWVar2);
  }
  this->bias_ = pWVar7;
  uVar3 = from->weightmatrixseconddimension_;
  this->weightmatrixfirstdimension_ = from->weightmatrixfirstdimension_;
  this->weightmatrixseconddimension_ = uVar3;
  bVar4 = from->transposeb_;
  bVar5 = from->hasbias_;
  bVar6 = from->int8dynamicquantize_;
  this->transposea_ = from->transposea_;
  this->transposeb_ = bVar4;
  this->hasbias_ = bVar5;
  this->int8dynamicquantize_ = bVar6;
  return;
}

Assistant:

BatchedMatMulLayerParams::BatchedMatMulLayerParams(const BatchedMatMulLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = nullptr;
  }
  if (from._internal_has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = nullptr;
  }
  ::memcpy(&weightmatrixfirstdimension_, &from.weightmatrixfirstdimension_,
    static_cast<size_t>(reinterpret_cast<char*>(&int8dynamicquantize_) -
    reinterpret_cast<char*>(&weightmatrixfirstdimension_)) + sizeof(int8dynamicquantize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BatchedMatMulLayerParams)
}